

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

ByteData256 *
cfd::CreateConfidentialTxSighash
          (ByteData256 *__return_storage_ptr__,ConfidentialTransactionContext *transaction,
          OutPoint *outpoint,UtxoData *utxo,SigHashType *sighash_type,Pubkey *pubkey,
          Script *redeem_script,WitnessVersion version,ByteData *param_8,TaprootScriptTree *param_9)

{
  _func_int **pp_Var1;
  bool bVar2;
  ConfidentialValue value;
  _func_int **local_c8;
  pointer puStack_c0;
  pointer local_b8;
  ConfidentialValue local_a8;
  Pubkey *local_78;
  ConfidentialValue local_70;
  SigHashType local_48;
  SigHashType local_3c;
  
  local_78 = pubkey;
  core::ConfidentialValue::ConfidentialValue(&local_70);
  bVar2 = core::ConfidentialValue::IsEmpty(&utxo->value_commitment);
  if (bVar2) {
    core::ConfidentialValue::ConfidentialValue(&local_a8,&utxo->amount);
    core::ConfidentialValue::operator=(&local_70,&local_a8);
    local_a8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
    if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    core::ConfidentialValue::operator=(&local_70,&utxo->value_commitment);
  }
  core::ByteData::ByteData((ByteData *)&local_a8);
  bVar2 = core::Script::IsEmpty(redeem_script);
  if (bVar2) {
    core::SigHashType::SigHashType(&local_3c,sighash_type);
    (*(transaction->super_ConfidentialTransaction).super_AbstractTransaction.
      _vptr_AbstractTransaction[0x16])
              (&local_c8,transaction,outpoint,local_78,&local_3c,&local_70,version);
  }
  else {
    core::SigHashType::SigHashType(&local_48,sighash_type);
    (*(transaction->super_ConfidentialTransaction).super_AbstractTransaction.
      _vptr_AbstractTransaction[0x17])
              (&local_c8,transaction,outpoint,redeem_script,&local_48,&local_70,version);
  }
  pp_Var1 = local_a8._vptr_ConfidentialValue;
  local_a8._vptr_ConfidentialValue = local_c8;
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puStack_c0;
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = local_b8;
  local_c8 = (_func_int **)0x0;
  puStack_c0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  if (pp_Var1 != (_func_int **)0x0) {
    operator_delete(pp_Var1);
    if (local_c8 != (_func_int **)0x0) {
      operator_delete(local_c8);
    }
  }
  core::ByteData256::ByteData256(__return_storage_ptr__,(ByteData *)&local_a8);
  if (local_a8._vptr_ConfidentialValue != (_func_int **)0x0) {
    operator_delete(local_a8._vptr_ConfidentialValue);
  }
  local_70._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
  if (local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static ByteData256 CreateConfidentialTxSighash(
    const ConfidentialTransactionContext* transaction,
    const OutPoint& outpoint, const UtxoData& utxo,
    const SigHashType& sighash_type, const Pubkey& pubkey,
    const Script& redeem_script, WitnessVersion version, const ByteData*,
    const TaprootScriptTree*) {
  ConfidentialValue value;
  if (utxo.value_commitment.IsEmpty()) {
    value = ConfidentialValue(utxo.amount);
  } else {
    value = utxo.value_commitment;
  }
  ByteData sig;
  if (redeem_script.IsEmpty()) {
    sig = transaction->CreateSignatureHash(
        outpoint, pubkey, sighash_type, value, version);
  } else {
    sig = transaction->CreateSignatureHash(
        outpoint, redeem_script, sighash_type, value, version);
  }
  return ByteData256(sig);
}